

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O3

void __thiscall
TTD::ExecutionInfoManager::GetLastExceptionTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  int64 iVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  
  iVar1 = (this->m_lastExceptionLocation).m_bpId;
  sourceLocation->m_sourceScriptLogId = (this->m_lastExceptionLocation).m_sourceScriptLogId;
  sourceLocation->m_bpId = iVar1;
  iVar1 = (this->m_lastExceptionLocation).m_ftime;
  sourceLocation->m_etime = (this->m_lastExceptionLocation).m_etime;
  sourceLocation->m_ftime = iVar1;
  sourceLocation->m_ltime = (this->m_lastExceptionLocation).m_ltime;
  uVar2 = (this->m_lastExceptionLocation).m_functionLine;
  uVar3 = (this->m_lastExceptionLocation).m_functionColumn;
  uVar4 = (this->m_lastExceptionLocation).m_line;
  sourceLocation->m_topLevelBodyId = (this->m_lastExceptionLocation).m_topLevelBodyId;
  sourceLocation->m_functionLine = uVar2;
  sourceLocation->m_functionColumn = uVar3;
  sourceLocation->m_line = uVar4;
  sourceLocation->m_column = (this->m_lastExceptionLocation).m_column;
  return;
}

Assistant:

void ExecutionInfoManager::GetLastExceptionTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        //If no exception then this will also clear sourceLocation
        sourceLocation.SetLocationCopy(this->m_lastExceptionLocation);
    }